

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b_update(blake2b_state *S,uint8_t *in,uint64_t inlen)

{
  size_t sVar1;
  ulong uVar2;
  ulong __n;
  ulong in_RDX;
  void *in_RSI;
  blake2b_state *in_RDI;
  size_t fill;
  size_t left;
  uint8_t *in_stack_000000e8;
  blake2b_state *in_stack_000000f0;
  ulong local_18;
  void *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (uVar2 = local_18, local_18 != 0) {
    sVar1 = in_RDI->buflen;
    __n = 0x100 - sVar1;
    if (__n < local_18) {
      memcpy(in_RDI->buf + sVar1,local_10,__n);
      in_RDI->buflen = __n + in_RDI->buflen;
      blake2b_increment_counter(in_RDI,0x80);
      blake2b_compress(in_stack_000000f0,in_stack_000000e8);
      memcpy(in_RDI->buf,in_RDI->buf + 0x80,0x80);
      in_RDI->buflen = in_RDI->buflen - 0x80;
      local_18 = local_18 - __n;
      uVar2 = __n;
    }
    else {
      memcpy(in_RDI->buf + sVar1,local_10,local_18);
      in_RDI->buflen = local_18 + in_RDI->buflen;
      local_18 = 0;
    }
    local_10 = (void *)(uVar2 + (long)local_10);
  }
  return 0;
}

Assistant:

int blake2b_update( blake2b_state *S, const uint8_t *in, uint64_t inlen )
{
  while( inlen > 0 )
  {
    size_t left = S->buflen;
    size_t fill = 2 * BLAKE2B_BLOCKBYTES - left;

    if( inlen > fill )
    {
      memcpy( S->buf + left, in, fill ); // Fill buffer
      S->buflen += fill;
      blake2b_increment_counter( S, BLAKE2B_BLOCKBYTES );
      blake2b_compress( S, S->buf ); // Compress
      memcpy( S->buf, S->buf + BLAKE2B_BLOCKBYTES, BLAKE2B_BLOCKBYTES ); // Shift buffer left
      S->buflen -= BLAKE2B_BLOCKBYTES;
      in += fill;
      inlen -= fill;
    }
    else // inlen <= fill
    {
      memcpy( S->buf + left, in, (size_t)inlen );
      S->buflen += (size_t)inlen; // Be lazy, do not compress
      in += inlen;
      inlen -= inlen;
    }
  }

  return 0;
}